

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

var __thiscall cs::runtime_type::parse_typeid(runtime_type *this,var *b)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  type_t *ptVar3;
  undefined *puVar4;
  undefined4 extraout_var_01;
  structure *psVar5;
  any *in_RDX;
  type_id *dat;
  type_info *args;
  
  if (in_RDX->mDat == (proxy *)0x0) {
    puVar4 = &void::typeinfo;
  }
  else {
    iVar2 = (*in_RDX->mDat->data->_vptr_baseHolder[2])();
    puVar4 = (undefined *)CONCAT44(extraout_var,iVar2);
  }
  pcVar1 = *(char **)(puVar4 + 8);
  if ((pcVar1 == "N2cs6type_tE") ||
     ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N2cs6type_tE"), iVar2 == 0)))) {
    ptVar3 = cs_impl::any::const_val<cs::type_t>(in_RDX);
    dat = &ptVar3->id;
  }
  else {
    if (in_RDX->mDat == (proxy *)0x0) {
      puVar4 = &void::typeinfo;
    }
    else {
      iVar2 = (*in_RDX->mDat->data->_vptr_baseHolder[2])();
      puVar4 = (undefined *)CONCAT44(extraout_var_00,iVar2);
    }
    pcVar1 = *(char **)(puVar4 + 8);
    if ((pcVar1 != "N2cs9structureE") &&
       ((*pcVar1 == '*' || (iVar2 = strcmp(pcVar1,"N2cs9structureE"), iVar2 != 0)))) {
      if (in_RDX->mDat == (proxy *)0x0) {
        args = (type_info *)&void::typeinfo;
      }
      else {
        iVar2 = (*in_RDX->mDat->data->_vptr_baseHolder[2])();
        args = (type_info *)CONCAT44(extraout_var_01,iVar2);
      }
      cs_impl::any::make<cs::type_id,std::type_info_const&>((any *)this,args);
      return (var)(proxy *)this;
    }
    psVar5 = cs_impl::any::const_val<cs::structure>(in_RDX);
    dat = &psVar5->m_id;
  }
  cs_impl::any::any<cs::type_id>((any *)this,dat);
  return (var)(proxy *)this;
}

Assistant:

var runtime_type::parse_typeid(const var &b)
	{
		if (b.type() == typeid(type_t))
			return b.const_val<type_t>().id;
		else if (b.type() == typeid(structure))
			return b.const_val<structure>().get_id();
		else
			return var::make<type_id>(b.type());
	}